

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  byte bVar1;
  FRAME_TYPE frame_type;
  aom_enc_pass aVar2;
  AV1_PRIMARY *pAVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int layer_depth;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  pAVar3 = cpi->ppi;
  bVar1 = cpi->gf_frame_index;
  iVar11 = (pAVar3->p_rc).gfu_boost;
  iVar9 = 0xf;
  if (iVar11 < 0x640) {
    iVar9 = iVar11 / 100;
  }
  iVar11 = (pAVar3->gf_group).layer_depth[bVar1];
  layer_depth = 6;
  if (iVar11 < 6) {
    layer_depth = iVar11;
  }
  if ((((bVar1 < 0x60) &&
       (*(char *)((long)((pAVar3->tpl_data).tpl_frame)->ref_map_index +
                 ((ulong)((uint)bVar1 * 0x60) - 0x20)) != '\0')) &&
      (bVar1 = (pAVar3->gf_group).update_type[bVar1], bVar1 < 4)) &&
     ((bVar1 != 1 && ((cpi->oxcf).q_cfg.aq_mode == '\0')))) {
    uVar14 = (uint)(cpi->common).superres_scale_denominator;
    iVar16 = mi_col * uVar14;
    iVar17 = iVar16 + 4;
    iVar18 = (cpi->common).mi_params.mi_rows;
    uVar7 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
    iVar11 = uVar7 + 3;
    iVar8 = uVar7 + 6;
    if (-1 < iVar11) {
      iVar8 = iVar11;
    }
    iVar8 = iVar8 >> 2;
    iVar11 = iVar18 + 3;
    iVar18 = iVar18 + 6;
    if (-1 < iVar11) {
      iVar18 = iVar11;
    }
    iVar18 = iVar18 >> 2;
    uVar7 = ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[sb_size] *
             uVar14 + 4 >> 3) + 3 >> 2;
    iVar11 = mi_row + 3;
    if (-1 < mi_row) {
      iVar11 = mi_row;
    }
    frame_type = (cpi->common).current_frame.frame_type;
    iVar11 = iVar11 >> 2;
    iVar15 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[sb_size]
              + 3 >> 2) + iVar11;
    iVar6 = iVar15;
    if (iVar18 < iVar15) {
      iVar6 = iVar18;
    }
    dVar25 = 0.0;
    lVar13 = (long)iVar8;
    dVar24 = 0.0;
    if (iVar11 < iVar6) {
      iVar10 = iVar16 + 0x23;
      if (-1 < iVar17) {
        iVar10 = iVar17;
      }
      iVar10 = iVar10 >> 5;
      iVar12 = uVar7 + iVar10;
      if (iVar8 < iVar12) {
        iVar12 = iVar8;
      }
      lVar20 = (long)iVar11;
      lVar21 = lVar20 * lVar13 + (long)iVar10;
      do {
        lVar19 = lVar21;
        lVar22 = (long)iVar12 - (long)iVar10;
        if (iVar10 < iVar12) {
          do {
            dVar23 = log(cpi->tpl_rdmult_scaling_factors[lVar19]);
            dVar25 = dVar25 + dVar23;
            dVar24 = dVar24 + 1.0;
            lVar22 = lVar22 + -1;
            lVar19 = lVar19 + 1;
          } while (lVar22 != 0);
        }
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + lVar13;
      } while (lVar20 != iVar6);
    }
    aVar2 = (cpi->oxcf).pass;
    uVar14 = 1;
    if (((aVar2 < AOM_RC_LAST_PASS) && (uVar14 = 0, aVar2 == AOM_RC_ONE_PASS)) &&
       (cpi->compressor_stage == '\0')) {
      uVar14 = (uint)(cpi->ppi->lap_enabled != 0);
    }
    iVar10 = av1_compute_rd_mult((cpi->common).quant_params.y_dc_delta_q +
                                 (cpi->common).quant_params.base_qindex,
                                 ((cpi->common).seq_params)->bit_depth,
                                 (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],layer_depth,
                                 iVar9,frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar14,
                                 (cpi->oxcf).tune_cfg.tuning);
    uVar14 = 1;
    aVar2 = (cpi->oxcf).pass;
    if (((aVar2 < AOM_RC_LAST_PASS) && (uVar14 = 0, aVar2 == AOM_RC_ONE_PASS)) &&
       (cpi->compressor_stage == '\0')) {
      uVar14 = (uint)(cpi->ppi->lap_enabled != 0);
    }
    iVar9 = av1_compute_rd_mult(x->rdmult_delta_qindex + (cpi->common).quant_params.base_qindex +
                                (cpi->common).quant_params.y_dc_delta_q,
                                ((cpi->common).seq_params)->bit_depth,
                                (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],layer_depth,
                                iVar9,frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar14,
                                (cpi->oxcf).tune_cfg.tuning);
    dVar23 = log((double)iVar9 / (double)iVar10);
    dVar23 = dVar23 - dVar25 / dVar24;
    if (dVar23 <= 700.0) {
      dVar25 = 0.0;
      if (-700.0 <= dVar23) {
        dVar25 = exp(dVar23);
      }
    }
    else {
      dVar25 = 1.79769313486232e+308;
    }
    if (iVar18 < iVar15) {
      iVar15 = iVar18;
    }
    if (iVar11 < iVar15) {
      iVar9 = iVar16 + 0x23;
      if (-1 < iVar17) {
        iVar9 = iVar17;
      }
      lVar20 = (long)iVar11;
      iVar9 = iVar9 >> 5;
      iVar11 = uVar7 + iVar9;
      if (iVar8 < iVar11) {
        iVar11 = iVar8;
      }
      lVar21 = lVar20 * lVar13 * 8;
      do {
        if (iVar9 < iVar11) {
          pdVar4 = cpi->tpl_rdmult_scaling_factors;
          pdVar5 = cpi->ppi->tpl_sb_rdmult_scaling_factors;
          lVar19 = (long)iVar9;
          do {
            *(double *)((long)pdVar5 + lVar19 * 8 + lVar21) =
                 *(double *)((long)pdVar4 + lVar19 * 8 + lVar21) * dVar25;
            lVar19 = lVar19 + 1;
          } while (iVar11 != lVar19);
        }
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + lVar13 * 8;
      } while (lVar20 != iVar6);
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi, MACROBLOCK *const x,
                             BLOCK_SIZE sb_size, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;

  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return;
  TplDepFrame *tpl_frame = &cpi->ppi->tpl_data.tpl_frame[tpl_idx];
  if (!tpl_frame->is_valid) return;
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) return;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return;

  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int sb_mi_width_sr = coded_to_superres_mi(
      mi_size_wide[sb_size], cm->superres_scale_denominator);

  const int bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (sb_mi_width_sr + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[sb_size] + num_mi_h - 1) / num_mi_h;
  int row, col;

  double base_block_count = 0.0;
  double log_sum = 0.0;

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      log_sum += log(cpi->tpl_rdmult_scaling_factors[index]);
      base_block_count += 1.0;
    }
  }

  const CommonQuantParams *quant_params = &cm->quant_params;

  const int orig_qindex_rdmult =
      quant_params->base_qindex + quant_params->y_dc_delta_q;
  const int orig_rdmult = av1_compute_rd_mult(
      orig_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int new_qindex_rdmult = quant_params->base_qindex +
                                x->rdmult_delta_qindex +
                                quant_params->y_dc_delta_q;
  const int new_rdmult = av1_compute_rd_mult(
      new_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const double scaling_factor = (double)new_rdmult / (double)orig_rdmult;

  double scale_adj = log(scaling_factor) - log_sum / base_block_count;
  scale_adj = exp_bounded(scale_adj);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      cpi->ppi->tpl_sb_rdmult_scaling_factors[index] =
          scale_adj * cpi->tpl_rdmult_scaling_factors[index];
    }
  }
}